

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_bbox.cpp
# Opt level: O0

int __thiscall FBoundingBox::BoxOnLineSide(FBoundingBox *this,line_t *ld)

{
  double dVar1;
  double dVar2;
  uint local_b4;
  undefined1 local_80 [32];
  undefined1 local_60 [24];
  double local_48;
  undefined1 local_40 [32];
  uint local_20;
  uint local_1c;
  int p2;
  int p1;
  line_t *ld_local;
  FBoundingBox *this_local;
  
  _p2 = (side_t *)ld;
  ld_local = (line_t *)this;
  line_t::Delta((line_t *)(local_40 + 0x10));
  if (((double)local_40._16_8_ != 0.0) || (NAN((double)local_40._16_8_))) {
    line_t::Delta((line_t *)(local_60 + 0x10));
    if ((local_48 != 0.0) || (NAN(local_48))) {
      line_t::Delta((line_t *)(local_80 + 0x10));
      line_t::Delta((line_t *)local_80);
      if ((double)local_80._16_8_ * (double)local_80._8_8_ < 0.0) {
        local_1c = P_PointOnLineSide(this->m_Box[3],this->m_Box[0],(line_t_conflict *)_p2);
        local_20 = P_PointOnLineSide(this->m_Box[2],this->m_Box[1],(line_t_conflict *)_p2);
      }
      else {
        local_1c = P_PointOnLineSide(this->m_Box[2],this->m_Box[0],(line_t_conflict *)_p2);
        local_20 = P_PointOnLineSide(this->m_Box[3],this->m_Box[1],(line_t_conflict *)_p2);
      }
    }
    else {
      dVar1 = this->m_Box[0];
      dVar2 = vertex_t::fY((vertex_t *)_p2->sector);
      local_1c = (uint)(dVar2 < dVar1);
      dVar1 = this->m_Box[1];
      dVar2 = vertex_t::fY((vertex_t *)_p2->sector);
      local_20 = (uint)(dVar2 < dVar1);
      line_t::Delta((line_t *)local_60);
      if ((double)local_60._0_8_ < 0.0) {
        local_1c = local_1c ^ 1;
        local_20 = local_20 ^ 1;
      }
    }
  }
  else {
    dVar1 = this->m_Box[3];
    dVar2 = vertex_t::fX((vertex_t *)_p2->sector);
    local_1c = (uint)(dVar1 < dVar2);
    dVar1 = this->m_Box[2];
    dVar2 = vertex_t::fX((vertex_t *)_p2->sector);
    local_20 = (uint)(dVar1 < dVar2);
    line_t::Delta((line_t *)local_40);
    if ((double)local_40._8_8_ < 0.0) {
      local_1c = local_1c ^ 1;
      local_20 = local_20 ^ 1;
    }
  }
  if (local_1c == local_20) {
    local_b4 = local_1c;
  }
  else {
    local_b4 = 0xffffffff;
  }
  return local_b4;
}

Assistant:

int FBoundingBox::BoxOnLineSide (const line_t *ld) const
{
	int p1;
	int p2;
		
	if (ld->Delta().X == 0)
	{ // ST_VERTICAL
		p1 = m_Box[BOXRIGHT] < ld->v1->fX();
		p2 = m_Box[BOXLEFT] < ld->v1->fX();
		if (ld->Delta().Y < 0)
		{
			p1 ^= 1;
			p2 ^= 1;
		}
	}
	else if (ld->Delta().Y == 0)
	{ // ST_HORIZONTAL:
		p1 = m_Box[BOXTOP] > ld->v1->fY();
		p2 = m_Box[BOXBOTTOM] > ld->v1->fY();
		if (ld->Delta().X < 0)
		{
			p1 ^= 1;
			p2 ^= 1;
		}
	}
	else if ((ld->Delta().X * ld->Delta().Y) >= 0)
	{ // ST_POSITIVE:
		p1 = P_PointOnLineSide (m_Box[BOXLEFT], m_Box[BOXTOP], ld);
		p2 = P_PointOnLineSide (m_Box[BOXRIGHT], m_Box[BOXBOTTOM], ld);
	}
	else
	{ // ST_NEGATIVE:
		p1 = P_PointOnLineSide (m_Box[BOXRIGHT], m_Box[BOXTOP], ld);
		p2 = P_PointOnLineSide (m_Box[BOXLEFT], m_Box[BOXBOTTOM], ld);
	}

	return (p1 == p2) ? p1 : -1;
}